

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# std.cpp
# Opt level: O0

size_t t3vsprintf(char *buf,size_t buflen,char *fmt,__va_list_tag *args0)

{
  byte bVar1;
  uint ival_00;
  bool bVar2;
  int iVar3;
  undefined8 *in_RCX;
  byte *pbVar4;
  byte *in_RDX;
  ulong in_RSI;
  byte *in_RDI;
  bool bVar5;
  bool bVar6;
  int ival;
  size_t lim;
  char *p;
  size_t i;
  int left_align;
  int add_ellipsis;
  int approx;
  int plus;
  char lead_char;
  int fld_prec;
  int fld_wid;
  char buf_1 [20];
  size_t txtlen;
  char *txt;
  char *nth;
  char *fmt_start;
  va_list args;
  char *dst;
  size_t need;
  size_t rem;
  uint *local_258;
  uint *local_238;
  uint *local_218;
  uint *local_1f8;
  uint *local_1d0;
  uint *local_1b0;
  uint *local_190;
  uint *local_170;
  uint *local_158;
  size_t local_140;
  uint *local_138;
  bool local_122;
  uint *local_120;
  uint *local_100;
  uint *local_e8;
  ulong local_d0;
  byte *local_c8;
  ulong local_c0;
  byte local_a1;
  uint local_a0;
  uint local_9c;
  byte local_98 [32];
  size_t local_78;
  byte *local_70;
  byte *local_68;
  byte *local_60;
  undefined8 local_58;
  uint *puStack_50;
  long local_48;
  byte *local_38;
  size_t local_30;
  ulong local_28;
  byte *local_18 [3];
  
  local_30 = 0;
  local_48 = in_RCX[2];
  local_58 = *in_RCX;
  puStack_50 = (uint *)in_RCX[1];
  local_38 = in_RDI;
  local_28 = in_RSI;
  local_18[0] = in_RDX;
  do {
    if (*local_18[0] == 0) {
      if (local_28 != 0) {
        *local_38 = 0;
      }
      return local_30;
    }
    if (*local_18[0] != 0x25) {
      local_30 = local_30 + 1;
      if (1 < local_28) {
        local_28 = local_28 - 1;
        *local_38 = *local_18[0];
        local_38 = local_38 + 1;
      }
      goto LAB_002498d5;
    }
    local_60 = local_18[0];
    local_68 = (byte *)0x379411;
    local_9c = 0xffffffff;
    local_a0 = 0xffffffff;
    local_a1 = 0x20;
    bVar2 = false;
    bVar5 = local_18[0][1] == 0x7e;
    pbVar4 = local_18[0] + 1;
    if (bVar5) {
      pbVar4 = local_18[0] + 2;
    }
    local_18[0] = pbVar4;
    bVar1 = *local_18[0];
    if (bVar1 == 0x2b) {
      local_18[0] = local_18[0] + 1;
    }
    bVar6 = *local_18[0] == 0x2d;
    if (bVar6) {
      local_18[0] = local_18[0] + 1;
    }
    if (*local_18[0] == 0x30) {
      local_a1 = 0x30;
    }
    iVar3 = is_digit(L'\0');
    if (iVar3 == 0) {
      if (*local_18[0] == 0x2a) {
        if ((uint)local_58 < 0x29) {
          local_e8 = (uint *)((int)(uint)local_58 + local_48);
          local_58._0_4_ = (uint)local_58 + 8;
        }
        else {
          local_e8 = puStack_50;
          puStack_50 = puStack_50 + 2;
        }
        local_9c = *local_e8;
        local_18[0] = local_18[0] + 1;
      }
    }
    else {
      local_9c = 0;
      while (iVar3 = is_digit(L'\0'), iVar3 != 0) {
        iVar3 = value_of_digit((int)(char)*local_18[0]);
        local_9c = iVar3 + local_9c * 10;
        local_18[0] = local_18[0] + 1;
      }
    }
    if (*local_18[0] == 0x2e) {
      if (local_18[0][1] == 0x2a) {
        if ((uint)local_58 < 0x29) {
          local_100 = (uint *)((int)(uint)local_58 + local_48);
          local_58._0_4_ = (uint)local_58 + 8;
        }
        else {
          local_100 = puStack_50;
          puStack_50 = puStack_50 + 2;
        }
        local_a0 = *local_100;
        local_18[0] = local_18[0] + 2;
      }
      else {
        local_a0 = 0;
        local_18[0] = local_18[0] + 1;
        while (iVar3 = is_digit(L'\0'), iVar3 != 0) {
          iVar3 = value_of_digit((int)(char)*local_18[0]);
          local_a0 = iVar3 + local_a0 * 10;
          local_18[0] = local_18[0] + 1;
        }
      }
    }
    switch(*local_18[0]) {
    case 0x25:
      local_70 = (byte *)0x37a27e;
      local_78 = 1;
      break;
    default:
      local_70 = (byte *)0x37a27e;
      local_78 = 1;
      local_18[0] = local_60;
      break;
    case 0x50:
      if ((uint)local_58 < 0x29) {
        local_138 = (uint *)((int)(uint)local_58 + local_48);
        local_58._0_4_ = (uint)local_58 + 8;
      }
      else {
        local_138 = puStack_50;
        puStack_50 = puStack_50 + 2;
      }
      local_70 = *(byte **)local_138;
      if (local_70 == (byte *)0x0) {
        local_70 = (byte *)0x379411;
      }
      if ((int)local_a0 < 0) {
        local_140 = strlen((char *)local_70);
      }
      else {
        local_140 = (size_t)(int)local_a0;
      }
      for (local_78 = local_140; local_78 != 0; local_78 = local_78 - 1) {
        iVar3 = (int)(char)*local_70;
        if ((((((iVar3 - 0x20U < 2) || (iVar3 - 0x23U < 2)) || (iVar3 - 0x26U < 7)) ||
             ((iVar3 == 0x2f || (iVar3 - 0x3aU < 2)))) ||
            ((iVar3 == 0x3d || ((iVar3 - 0x3fU < 2 || (iVar3 == 0x5b)))))) || (iVar3 == 0x5d)) {
          sprintf((char *)local_98,"%%%02x",(ulong)*local_70);
          local_30 = local_30 + 3;
          for (local_c0 = 0; pbVar4 = local_38, local_c0 < 3; local_c0 = local_c0 + 1) {
            if (1 < local_28) {
              local_38 = local_38 + 1;
              *pbVar4 = local_98[local_c0];
              local_28 = local_28 - 1;
            }
          }
        }
        else {
          local_30 = local_30 + 1;
          if (1 < local_28) {
            *local_38 = *local_70;
            local_28 = local_28 - 1;
            local_38 = local_38 + 1;
          }
        }
        local_70 = local_70 + 1;
      }
      break;
    case 99:
      if ((uint)local_58 < 0x29) {
        local_158 = (uint *)((int)(uint)local_58 + local_48);
        local_58._0_4_ = (uint)local_58 + 8;
      }
      else {
        local_158 = puStack_50;
        puStack_50 = puStack_50 + 2;
      }
      local_98[0] = (byte)*local_158;
      local_70 = local_98;
      local_78 = 1;
      break;
    case 100:
      if ((uint)local_58 < 0x29) {
        local_170 = (uint *)((int)(uint)local_58 + local_48);
        local_58._0_4_ = (uint)local_58 + 8;
      }
      else {
        local_170 = puStack_50;
        puStack_50 = puStack_50 + 2;
      }
      ival_00 = *local_170;
      sprintf((char *)local_98,"%d",(ulong)ival_00);
      local_68 = (byte *)check_nth((char **)local_18,ival_00);
      goto LAB_00248fb8;
    case 0x6c:
      pbVar4 = local_18[0] + 1;
      switch(local_18[0][1]) {
      case 100:
        if ((uint)local_58 < 0x29) {
          local_1f8 = (uint *)((int)(uint)local_58 + local_48);
          local_58._0_4_ = (uint)local_58 + 8;
        }
        else {
          local_1f8 = puStack_50;
          puStack_50 = puStack_50 + 2;
        }
        local_18[0] = pbVar4;
        sprintf((char *)local_98,"%ld",*(undefined8 *)local_1f8);
        break;
      default:
        local_70 = (byte *)0x37a27e;
        local_78 = 1;
        local_18[0] = local_60;
        goto LAB_002495fe;
      case 0x6f:
        if ((uint)local_58 < 0x29) {
          local_258 = (uint *)((int)(uint)local_58 + local_48);
          local_58._0_4_ = (uint)local_58 + 8;
        }
        else {
          local_258 = puStack_50;
          puStack_50 = puStack_50 + 2;
        }
        local_18[0] = pbVar4;
        sprintf((char *)local_98,"%lo",*(undefined8 *)local_258);
        break;
      case 0x75:
        if ((uint)local_58 < 0x29) {
          local_218 = (uint *)((int)(uint)local_58 + local_48);
          local_58._0_4_ = (uint)local_58 + 8;
        }
        else {
          local_218 = puStack_50;
          puStack_50 = puStack_50 + 2;
        }
        local_18[0] = pbVar4;
        sprintf((char *)local_98,"%lu",*(undefined8 *)local_218);
        break;
      case 0x78:
        if ((uint)local_58 < 0x29) {
          local_238 = (uint *)((int)(uint)local_58 + local_48);
          local_58._0_4_ = (uint)local_58 + 8;
        }
        else {
          local_238 = puStack_50;
          puStack_50 = puStack_50 + 2;
        }
        local_18[0] = pbVar4;
        sprintf((char *)local_98,"%lx",*(undefined8 *)local_238);
      }
      goto LAB_00248fb8;
    case 0x6f:
      if ((uint)local_58 < 0x29) {
        local_1d0 = (uint *)((int)(uint)local_58 + local_48);
        local_58._0_4_ = (uint)local_58 + 8;
      }
      else {
        local_1d0 = puStack_50;
        puStack_50 = puStack_50 + 2;
      }
      sprintf((char *)local_98,"%o",(ulong)*local_1d0);
      goto LAB_00248fb8;
    case 0x73:
      if ((uint)local_58 < 0x29) {
        local_120 = (uint *)((int)(uint)local_58 + local_48);
        local_58._0_4_ = (uint)local_58 + 8;
      }
      else {
        local_120 = puStack_50;
        puStack_50 = puStack_50 + 2;
      }
      local_70 = *(byte **)local_120;
      if (local_70 == (byte *)0x0) {
        local_70 = (byte *)0x35cad4;
      }
      local_78 = 0;
      local_c8 = local_70;
      while( true ) {
        local_122 = false;
        if (*local_c8 != 0) {
          local_122 = local_a0 == 0xffffffff || local_78 < (ulong)(long)(int)local_a0;
        }
        if (!local_122) break;
        local_c8 = local_c8 + 1;
        local_78 = local_78 + 1;
      }
      if (bVar5) {
        local_d0 = 0x3c;
        if ((local_9c != 0xffffffff) && (0x3c < local_9c)) {
          local_d0 = (ulong)(int)(local_9c - 3);
        }
        bVar2 = local_d0 < local_78;
        if (bVar2) {
          local_78 = local_d0;
        }
      }
      if ((local_9c != 0xffffffff) && (!bVar6)) {
        for (; local_78 < (ulong)(long)(int)local_9c; local_9c = local_9c - 1) {
          local_30 = local_30 + 1;
          if (1 < local_28) {
            local_28 = local_28 - 1;
            *local_38 = 0x20;
            local_38 = local_38 + 1;
          }
        }
      }
      break;
    case 0x75:
      if ((uint)local_58 < 0x29) {
        local_190 = (uint *)((int)(uint)local_58 + local_48);
        local_58._0_4_ = (uint)local_58 + 8;
      }
      else {
        local_190 = puStack_50;
        puStack_50 = puStack_50 + 2;
      }
      sprintf((char *)local_98,"%u",(ulong)*local_190);
      goto LAB_00248fb8;
    case 0x78:
      if ((uint)local_58 < 0x29) {
        local_1b0 = (uint *)((int)(uint)local_58 + local_48);
        local_58._0_4_ = (uint)local_58 + 8;
      }
      else {
        local_1b0 = puStack_50;
        puStack_50 = puStack_50 + 2;
      }
      sprintf((char *)local_98,"%x",(ulong)*local_1b0);
LAB_00248fb8:
      local_70 = local_98;
      local_78 = strlen((char *)local_98);
      if (((local_9c != 0xffffffff) && (!bVar6)) && (local_78 < (ulong)(long)(int)local_9c)) {
        if (((bVar1 == 0x2b) && (*local_70 != 0x2d)) && (local_30 = local_30 + 1, 1 < local_28)) {
          local_28 = local_28 - 1;
          *local_38 = 0x2b;
          local_38 = local_38 + 1;
        }
        if ((local_a1 == 0x30) && (*local_70 == 0x2d)) {
          local_30 = local_30 + 1;
          if (1 < local_28) {
            local_28 = local_28 - 1;
            *local_38 = 0x2d;
            local_38 = local_38 + 1;
          }
          local_70 = local_70 + 1;
          local_78 = local_78 - 1;
        }
        for (; local_78 < (ulong)(long)(int)local_9c; local_9c = local_9c - 1) {
          local_30 = local_30 + 1;
          if (1 < local_28) {
            local_28 = local_28 - 1;
            *local_38 = local_a1;
            local_38 = local_38 + 1;
          }
        }
      }
    }
LAB_002495fe:
    for (local_c0 = local_78; local_c0 != 0; local_c0 = local_c0 - 1) {
      local_30 = local_30 + 1;
      if (1 < local_28) {
        local_28 = local_28 - 1;
        *local_38 = *local_70;
        local_38 = local_38 + 1;
      }
      local_70 = local_70 + 1;
    }
    for (; *local_68 != 0; local_68 = local_68 + 1) {
      local_30 = local_30 + 1;
      if (1 < local_28) {
        local_28 = local_28 - 1;
        *local_38 = *local_68;
        local_38 = local_38 + 1;
      }
    }
    if (bVar2) {
      for (local_c0 = 3; local_c0 != 0; local_c0 = local_c0 + -1) {
        local_30 = local_30 + 1;
        if (1 < local_28) {
          local_28 = local_28 - 1;
          *local_38 = 0x2e;
          local_38 = local_38 + 1;
        }
      }
      local_78 = local_78 + 3;
    }
    if (((bVar6) && (local_9c != 0xffffffff)) && (local_78 < (ulong)(long)(int)local_9c)) {
      for (local_c0 = (ulong)(int)local_9c; local_78 < local_c0; local_c0 = local_c0 - 1) {
        local_30 = local_30 + 1;
        if (1 < local_28) {
          local_28 = local_28 - 1;
          *local_38 = 0x20;
          local_38 = local_38 + 1;
        }
      }
    }
LAB_002498d5:
    local_18[0] = local_18[0] + 1;
  } while( true );
}

Assistant:

size_t t3vsprintf(char *buf, size_t buflen, const char *fmt, va_list args0)
{
    size_t rem;
    size_t need = 0;
    char *dst;

    /* 
     *   make a private copy of the arguments, to ensure that we don't modify
     *   the caller's copy (on some platforms, va_list is a reference type;
     *   the caller might want to reuse their argument pointer for a two-pass
     *   operation, such as a pre-format pass to measure how much space is
     *   needed) 
     */
    va_list args;
    os_va_copy(args, args0);

    /* scan the buffer */
    for (dst = buf, rem = buflen ; *fmt != '\0' ; ++fmt)
    {
        /* check for a format specifier */
        if (*fmt == '%')
        {
            const char *fmt_start = fmt;
            const char *nth = "";
            const char *txt;
            size_t txtlen;
            char buf[20];
            int fld_wid = -1;
            int fld_prec = -1;
            char lead_char = ' ';
            int plus = FALSE;
            int approx = FALSE;
            int add_ellipsis = FALSE;
            int left_align = FALSE;
            size_t i;

            /* skip the '%' */
            ++fmt;

            /* check for the "approximation" flag */
            if (*fmt == '~')
            {
                approx = TRUE;
                ++fmt;
            }

            /* check for an explicit sign */
            if (*fmt == '+')
            {
                plus = TRUE;
                ++fmt;
            }

            /* check for left alignment */
            if (*fmt == '-')
            {
                left_align = TRUE;
                ++fmt;
            }

            /* if leading zeros are desired, note it */
            if (*fmt == '0')
                lead_char = '0';

            /* check for a field width specifier */
            if (is_digit(*fmt))
            {
                /* scan the digits */
                for (fld_wid = 0 ; is_digit(*fmt) ; ++fmt)
                {
                    fld_wid *= 10;
                    fld_wid += value_of_digit(*fmt);
                }
            }
            else if (*fmt == '*')
            {
                /* the value is an integer taken from the arguments */
                fld_wid = va_arg(args, int);

                /* skip the '*' */
                ++fmt;
            }

            /* check for a precision specifier */
            if (*fmt == '.')
            {
                /* skip the '.' */
                ++fmt;

                /* check what we have */
                if (*fmt == '*')
                {
                    /* the value is an integer taken from the arguments */
                    fld_prec = va_arg(args, int);

                    /* skip the '*' */
                    ++fmt;
                }
                else
                {
                    /* scan the digits */
                    for (fld_prec = 0 ; is_digit(*fmt) ; ++fmt)
                    {
                        fld_prec *= 10;
                        fld_prec += value_of_digit(*fmt);
                    }
                }
            }
            
            /* check what follows */
            switch (*fmt)
            {
            case '%':
                /* it's a literal '%' */
                txt = "%";
                txtlen = 1;
                break;

            case 's':
                /* the value is a (char *) */
                txt = va_arg(args, char *);

                /* if it's null, show "(null)" */
                if (txt == 0)
                    txt = "(null)";

                /* get the length, limiting it to the precision */
                {
                    const char *p;

                    /* 
                     *   Scan until we reach a null terminator, or until our
                     *   length reaches the maximum given by the precision
                     *   qualifier.  
                     */
                    for (txtlen = 0, p = txt ;
                         *p != '\0' && (fld_prec == -1
                                        || txtlen < (size_t)fld_prec) ;
                         ++p, ++txtlen) ;
                }

                /* 
                 *   if the 'approximation' flag is specified, limit the
                 *   string to 60 characters or the field width, whichever
                 *   is less 
                 */
                if (approx)
                {
                    size_t lim;
                    
                    /* the default limit is 60 characters */
                    lim = 60;

                    /* 
                     *   if a field width is specified, it overrides the
                     *   default - but take out three characters for the
                     *   '...' suffix 
                     */
                    if (fld_wid != -1 && (size_t)fld_wid > lim)
                        lim = fld_wid - 3;

                    /* if we're over the limit, shorten the string */
                    if (txtlen > lim)
                    {
                        /* shorten the string to the limit */
                        txtlen = lim;

                        /* add an ellipsis to indicate the truncation */
                        add_ellipsis = TRUE;
                    }
                }

                /* 
                 *   if a field width was specified and we have the default
                 *   right alignment, pad to the left with spaces if the
                 *   width is greater than the actual length 
                 */
                if (fld_wid != -1 && !left_align)
                {
                    for ( ; (size_t)fld_wid > txtlen ; --fld_wid)
                    {
                        ++need;
                        if (rem > 1)
                            --rem, *dst++ = ' ';
                    }
                }
                break;

            case 'P':
                /* 
                 *   URL parameter - this is a (char*) value with url
                 *   encoding applied 
                 */
                txt = va_arg(args, char *);

                /* if it's null, use an empty string */
                if (txt == 0)
                    txt = "";

                /* use the field precision if given, or the string length */
                txtlen = (fld_prec >= 0 ? fld_prec : strlen(txt));

                /* encode the parameter and add it to the buffer */
                for ( ; txtlen != 0 ; --txtlen, ++txt)
                {
                    switch (*txt)
                    {
                    case '!':
                    case '*':
                    case '\'':
                    case '(':
                    case ')':
                    case ';':
                    case ':':
                    case '@':
                    case '&':
                    case '=':
                    case '+':
                    case '$':
                    case ',':
                    case '/':
                    case '?':
                    case '#':
                    case '[':
                    case ']':
                    case ' ':
                        /* use % encoding for special characters */
                        sprintf(buf, "%%%02x", (unsigned)(uchar)*txt);
                        need += 3;
                        for (i = 0 ; i < 3 ; ++i)
                        {
                            if (rem > 1)
                                *dst++ = buf[i], --rem;
                        }
                        break;

                    default:
                        /* copy anything else as-is */
                        need += 1;
                        if (rem > 1)
                            *dst++ = *txt, --rem;
                        break;
                    }
                }
                break;

            case 'c':
                /* the value is a (char) */
                buf[0] = (char)va_arg(args, int);
                txt = buf;
                txtlen = 1;
                break;

            case 'd':
                /* the value is an int, formatted in decimal */
                {
                    int ival = va_arg(args, int);
                    sprintf(buf, "%d", ival);

                    /* check for '%dth' notation (1st, 2nd, etc) */
                    nth = check_nth(fmt, ival);
                }
                /* fall through to num_common: */
                
            num_common:
                /* use the temporary buffer where we formatted the value */
                txt = buf;
                txtlen = strlen(buf);

                /* 
                 *   Pad with leading spaces or zeros if the requested
                 *   field width exceeds the actual size and we have the
                 *   default left alignment.  
                 */
                if (fld_wid != -1 && !left_align && (size_t)fld_wid > txtlen)
                {
                    /* 
                     *   if we're showing an explicit sign, and we don't have
                     *   a leading '-' in the results, add it 
                     */
                    if (plus && txt[0] != '-')
                    {
                        /* add the '+' at the start of the output */
                        ++need;
                        if (rem > 1)
                            --rem, *dst++ = '+';
                    }

                    /* 
                     *   if we're showing leading zeros, and we have a
                     *   negative number, show the '-' first 
                     */
                    if (lead_char == '0' && txt[0] == '-')
                    {
                        /* add the '-' at the start of the output */
                        ++need;
                        if (rem > 1)
                            --rem, *dst++ = '-';
                        
                        /* we've shown the '-', so skip it in the number */
                        ++txt;
                        --txtlen;
                    }

                    /* add the padding */
                    for ( ; (size_t)fld_wid > txtlen ; --fld_wid)
                    {
                        ++need;
                        if (rem > 1)
                            --rem, *dst++ = lead_char;
                    }
                }

                /* done */
                break;

            case 'u':
                /* the value is an int, formatted as unsigned decimal */
                sprintf(buf, "%u", va_arg(args, int));
                goto num_common;

            case 'x':
                /* the value is an int, formatted in hex */
                sprintf(buf, "%x", va_arg(args, int));
                goto num_common;

            case 'o':
                /* the value is an int, formatted in hex */
                sprintf(buf, "%o", va_arg(args, int));
                goto num_common;

            case 'l':
                /* it's a 'long' value - get the second specifier */
                switch (*++fmt)
                {
                case 'd':
                    /* it's a long, formatted in decimal */
                    sprintf(buf, "%ld", va_arg(args, long));
                    goto num_common;

                case 'u':
                    /* it's a long, formatted as unsigned decimal */
                    sprintf(buf, "%lu", va_arg(args, long));
                    goto num_common;

                case 'x':
                    /* it's a long, formatted in hex */
                    sprintf(buf, "%lx", va_arg(args, long));
                    goto num_common;

                case 'o':
                    /* it's a long, formatted in octal */
                    sprintf(buf, "%lo", va_arg(args, long));
                    goto num_common;

                default:
                    /* bad specifier - show the literal text */
                    txt = "%";
                    txtlen = 1;
                    fmt = fmt_start;
                    break;
                }
                break;

            default:
                /* bad specifier - show the literal text */
                txt = "%";
                txtlen = 1;
                fmt = fmt_start;
                break;
            }

            /* add the text to the buffer */
            for (i = txtlen ; i != 0 ; --i, ++txt)
            {
                ++need;
                if (rem > 1)
                    --rem, *dst++ = *txt;
            }

            /* add the 'nth' suffix, if applicable */
            for ( ; *nth != 0 ; ++nth)
            {
                ++need;
                if (rem > 1)
                    --rem, *dst++ = *nth;
            }

            /* add an ellipsis if desired */
            if (add_ellipsis)
            {
                /* add three '.' characters */
                for (i = 3 ; i != 0 ; --i)
                {
                    ++need;
                    if (rem > 1)
                        --rem, *dst++ = '.';
                }

                /* for padding purposes, count the ellipsis */
                txtlen += 3;
            }

            /* 
             *   if we have left alignment and the actual length is less
             *   than the field width, pad to the right with spaces 
             */
            if (left_align && fld_wid != -1 && (size_t)fld_wid > txtlen)
            {
                /* add spaces to pad out to the field width */
                for (i = fld_wid ; i > txtlen ; --i)
                {
                    ++need;
                    if (rem > 1)
                        --rem, *dst++ = ' ';
                }
            }
        }
        else
        {
            /* it's not a format specifier - just copy it literally */
            ++need;
            if (rem > 1)
                --rem, *dst++ = *fmt;
        }
    }

    /* add the trailing null */
    if (rem != 0)
        *dst = '\0';

    /* bracket the va_copy at the top of the function */
    os_va_copy_end(args);

    /* return the needed length */
    return need;
}